

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::UnpackUnorm2x16Case::iterate(UnpackUnorm2x16Case *this)

{
  ShaderExecutor *pSVar1;
  float fVar2;
  float fVar3;
  deUint32 dVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  char *description;
  int iVar8;
  Hex<8UL> hex;
  int iVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  HexFloat local_214;
  HexFloat local_210;
  HexFloat local_20c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4 ^ 0x776002);
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in = (void *)((ulong)in._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x7fff8000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x80007fff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x1fffe);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  iVar8 = 0x5f;
  while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    in = (void *)CONCAT44(in._4_4_,dVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&inputs,(uint *)&in);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&outputs,(long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar1 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar1->_vptr_ShaderExecutor[6])
            (pSVar1,(ulong)((long)inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,&in,&out);
  uVar7 = (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar8 = 0;
  puVar5 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar10 = 0; lVar10 < (int)((ulong)((long)puVar6 - (long)puVar5) >> 2); lVar10 = lVar10 + 1) {
    auVar15._0_4_ = (float)(puVar5[lVar10] & 0xffff);
    auVar15._4_4_ = (float)(puVar5[lVar10] >> 0x10);
    auVar15._8_8_ = 0;
    auVar15 = divps(auVar15,ZEXT816(0x477fff00477fff00));
    fVar2 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10].m_data[0];
    fVar3 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar10].m_data[1];
    uVar13 = auVar15._0_4_;
    fVar12 = auVar15._4_4_;
    uVar14 = -(uint)((int)-fVar2 < (int)(uVar13 ^ 0x80000000));
    if (1 < (-(uint)((int)-fVar3 < (int)-fVar12) -
             ((int)fVar12 - (int)fVar3 ^ -(uint)((int)-fVar3 < (int)-fVar12)) |
            uVar14 - (uVar13 - (int)fVar2 ^ uVar14))) {
      if (iVar8 < 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar10);
        std::operator<<((ostream *)local_1a8,",\n");
        std::operator<<((ostream *)local_1a8,"  expected unpackUnorm2x16(");
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,") = ");
        std::operator<<((ostream *)local_1a8,"vec2(");
        out = (void *)CONCAT44(out._4_4_,uVar13);
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,(HexFloat *)&out);
        std::operator<<((ostream *)local_1a8,", ");
        local_20c.value = fVar12;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_20c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,", got vec2(");
        local_210.value = fVar2;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_210);
        std::operator<<((ostream *)local_1a8,", ");
        local_214.value = fVar3;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_214);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,"\n  ULP diffs = (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (iVar8 == 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      iVar8 = iVar8 + 1;
      puVar5 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar9 = (int)(uVar7 >> 2);
  std::ostream::operator<<(local_1a8,iVar9 - iVar8);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar9);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  description = "Pass";
  if (iVar8 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar8 != 0),description);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= float(in0) / 65535.0f;
				const float		ref1		= float(in1) / 65535.0f;
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0		= getUlpDiff(ref0, res0);
				const deUint32	diff1		= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}